

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O3

void __thiscall
helics::MessageConditionalOperator::~MessageConditionalOperator(MessageConditionalOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageConditionalOperator_004d0d78;
  p_Var1 = (this->evalFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->evalFunction,(_Any_data *)&this->evalFunction,__destroy_functor);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT MessageConditionalOperator: public FilterOperator {
  public:
    /** default constructor*/
    MessageConditionalOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit MessageConditionalOperator(
        std::function<bool(const Message*)> userConditionalFunction);
    /** set the function to modify the data of the message*/
    void setConditionFunction(std::function<bool(const Message*)> userConditionFunction);

  private:
    std::function<bool(const Message*)>
        evalFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}